

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.hpp
# Opt level: O0

ssize_t __thiscall
ranges::chunk_view_<ranges::ref_view<std::vector<int,_std::allocator<int>_>_>,_true>::adaptor<true>
::read(adaptor<true> *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  offset_t<true> *poVar2;
  undefined4 in_register_00000034;
  adaptor<true> *this_00;
  subrange<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_(ranges::subrange_kind)1>
  local_30;
  undefined8 *local_20;
  iterator_t<CRng> *it_local;
  adaptor<true> *this_local;
  
  this_00 = (adaptor<true> *)CONCAT44(in_register_00000034,__fd);
  local_20 = (undefined8 *)__buf;
  it_local = (iterator_t<CRng> *)this_00;
  this_local = this;
  bVar1 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)__buf,
                     &this_00->end_);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("it != end_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/furkankirac[P]cs321-2020-21-fall/range-v3/include/range/v3/view/chunk.hpp"
                  ,0x8c,
                  "<dependent type> ranges::chunk_view_<ranges::ref_view<std::vector<int>>, true>::adaptor<true>::read(const iterator_t<CRng> &) const [Rng = ranges::ref_view<std::vector<int>>, IsForwardRange = true, Const = true]"
                 );
  }
  poVar2 = offset(this_00);
  if (*poVar2 == 0) {
    make_subrange_fn::
    operator()<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
              ((make_subrange_fn *)&local_30,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)0x12fd8c,
               (int *)*local_20);
    views::take_base_fn::
    operator()<ranges::subrange<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_(ranges::subrange_kind)1>_>
              ((take_view<ranges::subrange<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_(ranges::subrange_kind)1>_>
                *)this,(take_base_fn *)&views::take,&local_30,this_00->n_);
    return (ssize_t)this;
  }
  __assert_fail("0 == offset()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/furkankirac[P]cs321-2020-21-fall/range-v3/include/range/v3/view/chunk.hpp"
                ,0x8d,
                "<dependent type> ranges::chunk_view_<ranges::ref_view<std::vector<int>>, true>::adaptor<true>::read(const iterator_t<CRng> &) const [Rng = ranges::ref_view<std::vector<int>>, IsForwardRange = true, Const = true]"
               );
}

Assistant:

constexpr auto read(iterator_t<CRng> const & it) const
                -> decltype(views::take(make_subrange(it, end_), n_))
            {
                RANGES_EXPECT(it != end_);
                RANGES_EXPECT(0 == offset());
                return views::take(make_subrange(it, end_), n_);
            }